

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall I_class::I_class(I_class *this,uchar *data)

{
  long lVar1;
  
  lVar1 = 5;
  do {
    (this->super_order).code[lVar1 + -2] = (uint)*data;
    lVar1 = lVar1 + -1;
    data = data + 1;
  } while (lVar1 != 1);
  (this->super_order)._vptr_order = (_func_int **)&PTR_ID_exe_00106c48;
  (this->super_order).op = I;
  this->imm = 0;
  this->rd_id = 0;
  this->rd_data = 0;
  this->rs_id1 = 0;
  this->rs_data1 = 0;
  this->func3 = 0;
  this->func7 = 0;
  this->shamt = 0;
  (this->super_order).EX_need = true;
  (this->super_order).MEM_need = false;
  (this->super_order).WB_need = true;
  return;
}

Assistant:

I_class ::I_class(unsigned char *data):order(data) {
    op=I;
    imm=0;
    rs_id1=0;
    rs_data1=0;
    rd_id=0;
    rd_data=0;
    shamt=0;
    func3=0;
    func7=0;
    EX_need=true;
    MEM_need=false;
    WB_need=true;
}